

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters_test.cpp
# Opt level: O2

void test_chars_encoding(char *value,vector<unsigned_char,_std::allocator<unsigned_char>_> *expected
                        )

{
  size_type *psVar1;
  bool bVar2;
  size_t sVar3;
  ResultBuilder *pRVar4;
  string_ref str;
  allocator local_819;
  int32_t read_offset;
  int32_t write_offset;
  SourceLineInfo local_810;
  char *value_local;
  string_ref read_back;
  string local_7d0;
  ScopedMessage scopedMessage48;
  ResultBuilder __catchResult;
  ScopedMessage scopedMessage42;
  array<unsigned_char,_1024UL> buffer;
  
  write_offset = 0;
  value_local = value;
  sVar3 = strlen(value);
  str.len_ = sVar3;
  str.ptr_ = value;
  cornelich::writers::chars::operator()((chars *)&__catchResult,buffer._M_elems,&write_offset,str);
  std::__cxx11::string::string((string *)&local_810,"INFO",(allocator *)&local_7d0);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&scopedMessage48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x2a);
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&__catchResult,&local_810.file,(SourceLineInfo *)&scopedMessage48,
             Info);
  psVar1 = &__catchResult.m_data.reconstructedExpression._M_string_length;
  std::operator<<((ostream *)psVar1,"value=");
  std::operator<<((ostream *)psVar1,value);
  std::operator<<((ostream *)psVar1,", write_offset=");
  std::ostream::operator<<(psVar1,write_offset);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage42,(MessageBuilder *)&__catchResult);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&__catchResult);
  std::__cxx11::string::~string((string *)&scopedMessage48);
  std::__cxx11::string::~string((string *)&local_810);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&scopedMessage48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x2b);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",(SourceLineInfo *)&scopedMessage48,
             "write_offset == expected.size()",Normal);
  std::__cxx11::string::~string((string *)&scopedMessage48);
  local_810.file._M_dataplus._M_p =
       (pointer)((expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish +
                -(long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_start);
  scopedMessage48.m_info.macroName._M_dataplus._M_p = (pointer)&__catchResult;
  scopedMessage48.m_info.macroName._M_string_length = (size_type)&write_offset;
  pRVar4 = Catch::ExpressionLhs<int_const&>::
           captureExpression<(Catch::Internal::Operator)0,unsigned_long>
                     ((ExpressionLhs<int_const&> *)&scopedMessage48,(unsigned_long *)&local_810);
  Catch::ResultBuilder::endExpression(pRVar4);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)&scopedMessage48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x2c);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",(SourceLineInfo *)&scopedMessage48,
             "std::equal(expected.begin(), expected.end(), buffer.begin())",Normal);
  std::__cxx11::string::~string((string *)&scopedMessage48);
  bVar2 = std::__equal<true>::equal<unsigned_char>
                    ((expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish,buffer._M_elems);
  scopedMessage48.m_info.macroName._M_string_length =
       CONCAT71(scopedMessage48.m_info.macroName._M_string_length._1_7_,bVar2);
  scopedMessage48.m_info.macroName._M_dataplus._M_p = (pointer)&__catchResult;
  Catch::ExpressionLhs<bool>::endExpression((ExpressionLhs<bool> *)&scopedMessage48);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  read_offset = 0;
  read_back = cornelich::readers::chars::operator()
                        ((chars *)&__catchResult,buffer._M_elems,&read_offset);
  std::__cxx11::string::string((string *)&local_7d0,"INFO",&local_819);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_810,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x30);
  Catch::MessageBuilder::MessageBuilder((MessageBuilder *)&__catchResult,&local_7d0,&local_810,Info)
  ;
  psVar1 = &__catchResult.m_data.reconstructedExpression._M_string_length;
  std::operator<<((ostream *)psVar1,"value=");
  std::operator<<((ostream *)psVar1,value_local);
  std::operator<<((ostream *)psVar1,", read_back=");
  boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)psVar1,&read_back);
  std::operator<<((ostream *)psVar1,", read_offset=");
  std::ostream::operator<<(psVar1,read_offset);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage48,(MessageBuilder *)&__catchResult);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&__catchResult);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_7d0);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_810,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x31);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_810,"write_offset == read_offset",Normal);
  std::__cxx11::string::~string((string *)&local_810);
  local_810.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_810.file._M_string_length = (size_type)&write_offset;
  pRVar4 = Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<int_const&> *)&local_810,&read_offset);
  Catch::ResultBuilder::endExpression(pRVar4);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_810,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x32);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_810,"read_back == value",Normal);
  std::__cxx11::string::~string((string *)&local_810);
  local_810.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_810.file._M_string_length = (size_type)&read_back;
  pRVar4 = Catch::ExpressionLhs<boost::basic_string_ref<char,std::char_traits<char>>const&>::
           captureExpression<(Catch::Internal::Operator)0,char_const*>
                     ((ExpressionLhs<boost::basic_string_ref<char,std::char_traits<char>>const&> *)
                      &local_810,&value_local);
  Catch::ResultBuilder::endExpression(pRVar4);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage48);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage42);
  return;
}

Assistant:

void test_chars_encoding(const char * value, const std::vector<std::uint8_t> & expected)
{
    std::array<std::uint8_t, 1024> buffer;
    std::int32_t write_offset = 0;

    writers::chars()(buffer.data(), write_offset, value);
    INFO("value=" << value << ", write_offset=" << write_offset);
    REQUIRE(write_offset == expected.size());
    REQUIRE(std::equal(expected.begin(), expected.end(), buffer.begin()));

    std::int32_t read_offset = 0;
    auto read_back = readers::chars()(buffer.data(), read_offset);
    INFO("value=" << value << ", read_back=" << read_back << ", read_offset=" << read_offset);
    REQUIRE(write_offset == read_offset);
    REQUIRE(read_back == value);
}